

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O2

void __thiscall EigrpPacket::Print(EigrpPacket *this,ostream *os)

{
  pointer psVar1;
  element_type *peVar2;
  ostream *poVar3;
  shared_ptr<Tlv> *var;
  pointer psVar4;
  
  poVar3 = std::operator<<(os,"Eigrp Packet:");
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(os,'\t');
  poVar3 = std::operator<<(poVar3,"opcode: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,(ushort)this->opcode);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(os,'\t');
  poVar3 = std::operator<<(poVar3,"flags: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(os,'\t');
  poVar3 = std::operator<<(poVar3,"virtual router id: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->v_router);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<(os,'\t');
  poVar3 = std::operator<<(poVar3,"autonomous system: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->as);
  std::operator<<(poVar3,'\n');
  std::endl<char,std::char_traits<char>>(os);
  psVar1 = (this->tlvs).
           super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar4 = (this->tlvs).
                super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    peVar2 = (psVar4->super___shared_ptr<Tlv,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_Tlv[2])(peVar2,os);
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void EigrpPacket::Print(std::ostream& os)
{
    os << "Eigrp Packet:" << '\n';
    os << '\t' << "opcode: " << (uint16_t)opcode << '\n';
    os << '\t' << "flags: " << flags << '\n';
    os << '\t' << "virtual router id: " << v_router << '\n';
    os << '\t' << "autonomous system: " << as << '\n';
    os << std::endl;

    for (auto& var : tlvs)
    {
        var->Print(os);
    }
    os << std::endl;
}